

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-lex.c
# Opt level: O2

int ztlex_isname(ztlex_t *lex)

{
  int iVar1;
  ushort **ppuVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = (*lex->getC)(lex);
  if (iVar1 == -1) {
    uVar4 = 0xffffffffffffffff;
  }
  else {
    ppuVar2 = __ctype_b_loc();
    if ((iVar1 == 0x5f) || (((*ppuVar2)[iVar1] & 0x400) != 0)) {
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        uVar4 = uVar3 + 1;
        lex->lexeme[uVar3] = (char)iVar1;
        iVar1 = (*lex->getC)(lex);
        if (0xfd < uVar3) break;
      } while (iVar1 == 0x5f || (char)(((*ppuVar2)[iVar1] & 8) >> 3) != '\0');
      if (((((*ppuVar2)[iVar1] & 8) == 0) && (iVar1 != -1)) && (iVar1 != 0x5f)) {
        (*lex->ungetC)(iVar1,lex);
      }
      lex->lexeme[uVar3 + 1] = '\0';
    }
    else {
      (*lex->ungetC)(iVar1,lex);
      uVar4 = 0;
    }
  }
  return (int)uVar4;
}

Assistant:

int ztlex_isname(ztlex_t *lex)
{
  int i = 0;
  int c;

  c = lex->getC(lex);
  if (c == EOF)
    return EOF;

  if (!(isalpha(c) || c == '_'))
  {
    lex->ungetC(c, lex);
    return 0;
  }

  do
  {
    lex->lexeme[i++] = c;
    c = lex->getC(lex);
  }
  while ((isalnum(c) || c == '_') && i < MAXLEXEME - 1);

  if (c != EOF && !(isalnum(c) || c == '_'))
    lex->ungetC(c, lex);

  lex->lexeme[i] = '\0';
  return i;
}